

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O0

ALLEGRO_PATH * al_create_path_for_directory(char *str)

{
  ALLEGRO_PATH *pAVar1;
  size_t sVar2;
  ALLEGRO_USTR *pAVar3;
  ALLEGRO_USTR *last;
  ALLEGRO_PATH *path;
  char *in_stack_ffffffffffffffd8;
  ALLEGRO_USTR *in_stack_ffffffffffffffe0;
  ALLEGRO_PATH *path_00;
  char *in_stack_ffffffffffffffe8;
  ALLEGRO_USTR *us;
  
  pAVar1 = al_create_path(in_stack_ffffffffffffffe8);
  sVar2 = al_ustr_length(in_stack_ffffffffffffffe0);
  if (sVar2 != 0) {
    us = pAVar1->filename;
    pAVar3 = al_ustr_new((char *)0x17c2d6);
    pAVar1->filename = pAVar3;
    path_00 = pAVar1;
    al_cstr(us);
    al_append_path_component(path_00,in_stack_ffffffffffffffd8);
    al_ustr_free((ALLEGRO_USTR *)0x17c30d);
  }
  return pAVar1;
}

Assistant:

ALLEGRO_PATH *al_create_path_for_directory(const char *str)
{
   ALLEGRO_PATH *path = al_create_path(str);
   if (al_ustr_length(path->filename)) {
      ALLEGRO_USTR *last = path->filename;
      path->filename = al_ustr_new("");
      al_append_path_component(path, al_cstr(last));
      al_ustr_free(last);
   }
   return path;
}